

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

void tlstran_pipe_recv_cb(void *arg)

{
  undefined8 uVar1;
  nni_msg *pnVar2;
  uint64_t uVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  nni_aio *aio_00;
  nni_aio *aio_01;
  size_t sVar7;
  undefined1 local_128 [8];
  nni_iov iov;
  char peername [64];
  nng_sockaddr *sa;
  nng_sockaddr_storage ss;
  uint64_t len;
  nni_aio *rxaio;
  nni_msg *msg;
  size_t n;
  int rv;
  nni_aio *aio;
  tlstran_pipe *p;
  void *arg_local;
  
  aio_00 = (nni_aio *)((long)arg + 0x268);
  nni_mtx_lock((nni_mtx *)((long)arg + 0x600));
  aio_01 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x50));
  n._4_4_ = nni_aio_result(aio_00);
  if (n._4_4_ == NNG_OK) {
    sVar7 = nni_aio_count(aio_00);
    nni_aio_iov_advance(aio_00,sVar7);
    sVar7 = nni_aio_iov_count(aio_00);
    if (sVar7 != 0) {
      nng_stream_recv(*arg,aio_00);
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x600));
      return;
    }
    if (*(long *)((long)arg + 0x5f8) != 0) {
LAB_0013b646:
      nni_aio_list_remove(aio_01);
      pnVar2 = *(nni_msg **)((long)arg + 0x5f8);
      *(undefined8 *)((long)arg + 0x5f8) = 0;
      sVar7 = nni_msg_len(pnVar2);
      iVar4 = nni_list_empty((nni_list *)((long)arg + 0x50));
      if (iVar4 == 0) {
        tlstran_pipe_recv_start((tlstran_pipe *)arg);
      }
      nni_pipe_bump_rx(*(nni_pipe **)((long)arg + 8),sVar7);
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x600));
      nni_aio_set_msg(aio_01,pnVar2);
      nni_aio_finish_sync(aio_01,NNG_OK,sVar7);
      return;
    }
    ss.sa_pad[0xf] =
         ((ulong)*(byte *)((long)arg + 0x78) << 0x38) + ((ulong)*(byte *)((long)arg + 0x79) << 0x30)
         + ((ulong)*(byte *)((long)arg + 0x7a) << 0x28) +
         ((ulong)*(byte *)((long)arg + 0x7b) << 0x20) +
         (ulong)*(byte *)((long)arg + 0x7c) * 0x1000000 +
         (ulong)*(byte *)((long)arg + 0x7d) * 0x10000 + (ulong)*(byte *)((long)arg + 0x7e) * 0x100 +
         (ulong)*(byte *)((long)arg + 0x7f);
    if ((*(ulong *)((long)arg + 0x18) < ss.sa_pad[0xf]) && (*(long *)((long)arg + 0x18) != 0)) {
      memcpy(&iov.iov_len,"unknown",0x40);
      iVar4 = nng_stream_get_addr(*arg,"remote-address",(nng_sockaddr *)&sa);
      if (iVar4 == 0) {
        nng_str_sockaddr((nng_sockaddr *)&sa,(char *)&iov.iov_len,0x40);
      }
      uVar3 = ss.sa_pad[0xf];
      uVar1 = *(undefined8 *)((long)arg + 0x18);
      uVar5 = nni_pipe_sock_id(*(nni_pipe **)((long)arg + 8));
      uVar6 = nni_pipe_id(*(nni_pipe **)((long)arg + 8));
      nng_log_warn("NNG-RCVMAX",
                   "Oversize message of %lu bytes (> %lu) on socket<%u> pipe<%u> from TLS %s",uVar3,
                   uVar1,(ulong)uVar5,(ulong)uVar6,&iov.iov_len);
      n._4_4_ = NNG_EMSGSIZE;
    }
    else {
      n._4_4_ = nni_msg_alloc((nni_msg **)((long)arg + 0x5f8),ss.sa_pad[0xf]);
      if (n._4_4_ == NNG_OK) {
        if (ss.sa_pad[0xf] != 0) {
          local_128 = (undefined1  [8])nni_msg_body(*(nni_msg **)((long)arg + 0x5f8));
          iov.iov_buf = (void *)ss.sa_pad[0xf];
          nni_aio_set_iov(aio_00,1,(nni_iov *)local_128);
          nng_stream_recv(*arg,aio_00);
          nni_mtx_unlock((nni_mtx *)((long)arg + 0x600));
          return;
        }
        goto LAB_0013b646;
      }
    }
  }
  nni_aio_list_remove(aio_01);
  pnVar2 = *(nni_msg **)((long)arg + 0x5f8);
  *(undefined8 *)((long)arg + 0x5f8) = 0;
  nni_pipe_bump_error(*(nni_pipe **)((long)arg + 8),n._4_4_);
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x600));
  nni_msg_free(pnVar2);
  nni_aio_finish_error(aio_01,n._4_4_);
  return;
}

Assistant:

static void
tlstran_pipe_recv_cb(void *arg)
{
	tlstran_pipe *p = arg;
	nni_aio      *aio;
	int           rv;
	size_t        n;
	nni_msg      *msg;
	nni_aio      *rxaio = &p->rxaio;

	nni_mtx_lock(&p->mtx);
	aio = nni_list_first(&p->recvq);

	if ((rv = nni_aio_result(rxaio)) != 0) {
		goto recv_error;
	}

	n = nni_aio_count(rxaio);
	nni_aio_iov_advance(rxaio, n);
	if (nni_aio_iov_count(rxaio) > 0) {
		// Was this a partial read?  If so then resubmit for the rest.
		nng_stream_recv(p->tls, rxaio);
		nni_mtx_unlock(&p->mtx);
		return;
	}

	// If we don't have a message yet, we were reading the TCP message
	// header, which is just the length.  This tells us the size of the
	// message to allocate and how much more to expect.
	if (p->rxmsg == NULL) {
		uint64_t len;
		// We should have gotten a message header.
		NNI_GET64(p->rxlen, len);

		// Make sure the message payload is not too big.  If it is
		// the caller will shut down the pipe.
		if ((len > p->rcvmax) && (p->rcvmax > 0)) {
			nng_sockaddr_storage ss;
			nng_sockaddr        *sa = (nng_sockaddr *) &ss;
			char                 peername[64] = "unknown";
			if ((rv = nng_stream_get_addr(
			         p->tls, NNG_OPT_REMADDR, sa)) == 0) {
				(void) nng_str_sockaddr(
				    sa, peername, sizeof(peername));
			}
			nng_log_warn("NNG-RCVMAX",
			    "Oversize message of %lu bytes (> %lu) "
			    "on socket<%u> pipe<%u> from TLS %s",
			    (unsigned long) len, (unsigned long) p->rcvmax,
			    nni_pipe_sock_id(p->npipe), nni_pipe_id(p->npipe),
			    peername);
			rv = NNG_EMSGSIZE;
			goto recv_error;
		}

		if ((rv = nni_msg_alloc(&p->rxmsg, (size_t) len)) != 0) {
			goto recv_error;
		}

		// Submit the rest of the data for a read -- we want to
		// read the entire message now.
		if (len != 0) {
			nni_iov iov;
			iov.iov_buf = nni_msg_body(p->rxmsg);
			iov.iov_len = (size_t) len;
			nni_aio_set_iov(rxaio, 1, &iov);

			nng_stream_recv(p->tls, rxaio);
			nni_mtx_unlock(&p->mtx);
			return;
		}
	}

	// We read a message completely.  Let the user know the good news.
	nni_aio_list_remove(aio);
	msg      = p->rxmsg;
	p->rxmsg = NULL;
	n        = nni_msg_len(msg);
	if (!nni_list_empty(&p->recvq)) {
		tlstran_pipe_recv_start(p);
	}
	nni_pipe_bump_rx(p->npipe, n);
	nni_mtx_unlock(&p->mtx);

	nni_aio_set_msg(aio, msg);
	nni_aio_finish_sync(aio, 0, n);
	return;

recv_error:
	nni_aio_list_remove(aio);
	msg      = p->rxmsg;
	p->rxmsg = NULL;
	nni_pipe_bump_error(p->npipe, rv);
	// Intentionally, we do not queue up another receive.
	// The protocol should notice this error and close the pipe.
	nni_mtx_unlock(&p->mtx);
	nni_msg_free(msg);
	nni_aio_finish_error(aio, rv);
}